

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *__s;
  long lVar7;
  sunindextype i;
  long lVar8;
  double dVar9;
  
  lVar6 = N_VGetArrayPointer(x);
  __s = (void *)N_VGetArrayPointer(y);
  plVar1 = (long *)A->content;
  lVar2 = plVar1[1];
  if (0 < lVar2) {
    lVar8 = 0;
    memset(__s,0,lVar2 * 8);
    lVar3 = *plVar1;
    lVar4 = plVar1[4];
    do {
      if (0 < lVar3) {
        lVar5 = *(long *)(lVar4 + lVar8 * 8);
        dVar9 = *(double *)((long)__s + lVar8 * 8);
        lVar7 = 0;
        do {
          dVar9 = dVar9 + *(double *)(lVar5 + lVar7 * 8) * *(double *)(lVar6 + lVar7 * 8);
          *(double *)((long)__s + lVar8 * 8) = dVar9;
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  sunrealtype *xd, *yd;
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = A^T x */
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++) { yd[i] = ZERO; }
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++)
  {
    sunrealtype* row_i = SM_COLUMN_D(A, i);
    for (sunindextype j = 0; j < SM_ROWS_D(A); j++)
    {
      yd[i] += row_i[j] * xd[j];
    }
  }
  return SUN_SUCCESS;
}